

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# panning.cpp
# Opt level: O0

unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_>
anon_unknown.dwarf_1cab89::CreateStablizer(size_t outchans,ALuint srate)

{
  pointer pFVar1;
  iterator paVar2;
  iterator __last;
  EVP_PKEY_CTX *in_RSI;
  _Head_base<0UL,_FrontStablizer_*,_false> in_RDI;
  array<float,_256UL> *buf;
  iterator __end1;
  iterator __begin1;
  FlexArray<std::array<float,_256UL>,_16UL> *__range1;
  unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_> *stablizer;
  size_t in_stack_ffffffffffffffc8;
  iterator local_28;
  
  FrontStablizer::Create(in_stack_ffffffffffffffc8);
  pFVar1 = std::unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_>::operator->
                     ((unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_> *)0x215e58);
  local_28 = al::FlexArray<std::array<float,_256UL>,_16UL>::begin(&pFVar1->DelayBuf);
  paVar2 = al::FlexArray<std::array<float,_256UL>,_16UL>::end(&pFVar1->DelayBuf);
  for (; local_28 != paVar2; local_28 = local_28 + 1) {
    __last = std::array<float,_256UL>::begin((array<float,_256UL> *)0x215ea1);
    in_RSI = (EVP_PKEY_CTX *)std::array<float,_256UL>::end((array<float,_256UL> *)0x215eaf);
    std::fill<float*,float>((float *)in_RDI._M_head_impl,__last,(float *)0x215ec8);
  }
  pFVar1 = std::unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_>::operator->
                     ((unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_> *)0x215f02);
  BandSplitterR<float>::init(&pFVar1->MidFilter,in_RSI);
  return (__uniq_ptr_data<FrontStablizer,_std::default_delete<FrontStablizer>,_true,_true>)
         (tuple<FrontStablizer_*,_std::default_delete<FrontStablizer>_>)in_RDI._M_head_impl;
}

Assistant:

std::unique_ptr<FrontStablizer> CreateStablizer(const size_t outchans, const ALuint srate)
{
    auto stablizer = FrontStablizer::Create(outchans);
    for(auto &buf : stablizer->DelayBuf)
        std::fill(buf.begin(), buf.end(), 0.0f);

    /* Initialize band-splitting filter for the mid signal, with a crossover at
     * 5khz (could be higher).
     */
    stablizer->MidFilter.init(5000.0f / static_cast<float>(srate));

    return stablizer;
}